

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

void testBufferCompression(string *tempdir)

{
  initializer_list<char> __l;
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  size_type sVar4;
  char *pcVar5;
  reference pvVar6;
  size_type sVar7;
  ostream *this;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  size_t outsz;
  vector<char,_std::allocator<char>_> cbuf;
  vector<char,_std::allocator<char>_> buf;
  size_t bc128;
  size_t bc0;
  char *in_stack_fffffffffffffe78;
  ulong *func;
  uint in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  iterator in_stack_fffffffffffffe98;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  ulong local_78 [3];
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 *local_58;
  undefined8 local_50;
  vector<char,_std::allocator<char>_> local_48;
  vector<char,_std::allocator<char>_> local_30;
  ulong local_18;
  ulong local_10;
  
  local_10 = exr_compress_max_buffer_size(0);
  local_18 = exr_compress_max_buffer_size(0x80);
  if (local_10 < 9) {
    core_test_fail((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe84,in_stack_fffffffffffffe78);
  }
  if (local_18 < 0x89) {
    core_test_fail((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe84,in_stack_fffffffffffffe78);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Max Buffer Size (0): ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Max Buffer Size (128): ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x10d1a4);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x10d1b1);
  local_5f = 0x4f;
  local_5e = 0x70;
  local_5d = 0x65;
  local_5c = 0x6e;
  local_5b = 0x45;
  local_5a = 0x58;
  local_59 = 0x52;
  local_58 = &local_5f;
  local_50 = 7;
  __l._M_len = (size_type)in_stack_fffffffffffffea0;
  __l._M_array = in_stack_fffffffffffffe98;
  std::vector<char,_std::allocator<char>_>::operator=(in_stack_fffffffffffffe90,__l);
  sVar4 = std::vector<char,_std::allocator<char>_>::size(&local_30);
  exr_compress_max_buffer_size(sVar4);
  std::vector<char,_std::allocator<char>_>::resize
            (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
  pcVar5 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x10d26f);
  sVar4 = std::vector<char,_std::allocator<char>_>::size(&local_30);
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
  sVar7 = std::vector<char,_std::allocator<char>_>::size(&local_48);
  func = local_78;
  iVar2 = exr_compress_buffer(0,9,pcVar5,sVar4,pvVar6,sVar7);
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message(iVar2);
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe84,(char *)func);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"compressed size: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_78[0]);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar5 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x10d475);
  uVar1 = local_78[0];
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](&local_30,0);
  sVar4 = std::vector<char,_std::allocator<char>_>::size(&local_30);
  iVar2 = exr_uncompress_buffer(0,pcVar5,uVar1,pvVar6,sVar4,local_78);
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message(iVar2);
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe84,(char *)func);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"uncompressed size: ");
  this = (ostream *)std::ostream::operator<<(poVar3,local_78[0]);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](&local_30,0);
  if (*pvVar6 != 'O') {
    core_test_fail((char *)poVar3,(char *)this,in_stack_fffffffffffffe84,(char *)func);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)poVar3);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)poVar3);
  return;
}

Assistant:

void
testBufferCompression (const std::string& tempdir)
{
    size_t bc0   = exr_compress_max_buffer_size (0);
    size_t bc128 = exr_compress_max_buffer_size (128);
    if (bc0 < 9) EXRCORE_TEST_FAIL (bc0 < 9);
    if (bc128 < 128 + 9) EXRCORE_TEST_FAIL (bc0 < 9);
    std::cout << "Max Buffer Size (0): " << bc0 << std::endl;
    std::cout << "Max Buffer Size (128): " << bc128 << std::endl;

    std::vector<char> buf, cbuf;
    buf = {'O', 'p', 'e', 'n', 'E', 'X', 'R'};
    cbuf.resize (exr_compress_max_buffer_size (buf.size ()));
    size_t outsz;
    EXRCORE_TEST_RVAL (exr_compress_buffer (
        nullptr, 9, buf.data (), buf.size (), &cbuf[0], cbuf.size (), &outsz));
    std::cout << "compressed size: " << outsz << std::endl;
    EXRCORE_TEST_RVAL (exr_uncompress_buffer (
        nullptr, cbuf.data (), outsz, &buf[0], buf.size (), &outsz));
    std::cout << "uncompressed size: " << outsz << std::endl;
    if (buf[0] != 'O') EXRCORE_TEST_FAIL (buf[0] != 'O');
}